

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

JavascriptPromiseReaction *
Js::JavascriptPromiseReaction::New
          (JavascriptPromiseCapability *capabilities,RecyclableObject *handler,
          ScriptContext *scriptContext)

{
  Recycler *alloc;
  JavascriptPromiseReaction *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7bb7f26;
  data.filename._0_4_ = 0x847;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
  this = (JavascriptPromiseReaction *)new<Memory::Recycler>(0x18,alloc,0x38bbb2);
  JavascriptPromiseReaction(this,capabilities,handler);
  return this;
}

Assistant:

JavascriptPromiseReaction* JavascriptPromiseReaction::New(JavascriptPromiseCapability* capabilities, RecyclableObject* handler, ScriptContext* scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptPromiseReaction, capabilities, handler);
    }